

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O2

void * background_thread_entry(void *ind_arg)

{
  ulong *puVar1;
  background_thread_info_t *pbVar2;
  background_thread_info_t *pbVar3;
  _Bool _Var4;
  pthread_t __target_thread;
  ulong uVar5;
  tsd_t *tsd;
  uint ind;
  background_thread_info_t *info;
  char *in_FS_OFFSET;
  cpu_set_t local_b8;
  
  __target_thread = pthread_self();
  pthread_setname_np(__target_thread,"jemalloc_bg_thd");
  ind = (uint)ind_arg;
  if (opt_percpu_arena != percpu_arena_disabled) {
    local_b8.__bits[0xe] = 0;
    local_b8.__bits[0xf] = 0;
    local_b8.__bits[0xc] = 0;
    local_b8.__bits[0xd] = 0;
    local_b8.__bits[10] = 0;
    local_b8.__bits[0xb] = 0;
    local_b8.__bits[8] = 0;
    local_b8.__bits[9] = 0;
    local_b8.__bits[6] = 0;
    local_b8.__bits[7] = 0;
    local_b8.__bits[4] = 0;
    local_b8.__bits[5] = 0;
    local_b8.__bits[2] = 0;
    local_b8.__bits[3] = 0;
    local_b8.__bits[0] = 0;
    local_b8.__bits[1] = 0;
    if (ind < 0x400) {
      puVar1 = (ulong *)((long)local_b8.__bits + (ulong)((uint)((ulong)ind_arg >> 3) & 0x78));
      *puVar1 = *puVar1 | 1L << ((byte)ind_arg & 0x3f);
    }
    sched_setaffinity(0,0x80,&local_b8);
  }
  tsd = *(tsd_t **)in_FS_OFFSET;
  if (*in_FS_OFFSET != '\0') {
    tsd = tsd_fetch_slow(tsd,true);
  }
  tsd_state_set(tsd,'\x05');
  pbVar3 = background_thread_info;
  uVar5 = (ulong)ind_arg & 0xffffffff;
  info = background_thread_info + uVar5;
  pbVar2 = background_thread_info + uVar5;
  malloc_mutex_lock((tsdn_t *)tsd,&pbVar2->mtx);
  ((atomic_b_t *)((long)(&pbVar2->mtx + 1) + 4))->repr = true;
  nstime_init(&pbVar3[uVar5].next_wakeup,0xffffffffffffffff);
  if (ind == 0) {
    background_thread0_work(tsd);
  }
  else {
    while (info->state != background_thread_stopped) {
      _Var4 = background_thread_pause_check((tsdn_t *)tsd,info);
      if (!_Var4) {
        background_work_sleep_once((tsdn_t *)tsd,info,ind);
      }
    }
  }
  (info->indefinite_sleep).repr = false;
  nstime_init(&pbVar3[uVar5].next_wakeup,0);
  (info->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(info->mtx).field_0 + 0x40));
  return (void *)0x0;
}

Assistant:

static void *
background_thread_entry(void *ind_arg) {
	unsigned thread_ind = (unsigned)(uintptr_t)ind_arg;
	assert(thread_ind < max_background_threads);
#ifdef JEMALLOC_HAVE_PTHREAD_SETNAME_NP
	pthread_setname_np(pthread_self(), "jemalloc_bg_thd");
#elif defined(__FreeBSD__)
	pthread_set_name_np(pthread_self(), "jemalloc_bg_thd");
#endif
	if (opt_percpu_arena != percpu_arena_disabled) {
		set_current_thread_affinity((int)thread_ind);
	}
	/*
	 * Start periodic background work.  We use internal tsd which avoids
	 * side effects, for example triggering new arena creation (which in
	 * turn triggers another background thread creation).
	 */
	background_work(tsd_internal_fetch(), thread_ind);
	assert(pthread_equal(pthread_self(),
	    background_thread_info[thread_ind].thread));

	return NULL;
}